

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackIFWGenerator::GetRootPackageName_abi_cxx11_
          (string *__return_storage_ptr__,cmCPackIFWGenerator *this)

{
  char *pcVar1;
  allocator local_3a9;
  string local_3a8;
  char *local_388;
  char *optPACKAGE_NAME;
  string local_378;
  char *local_358;
  char *optIFW_PACKAGE_NAME;
  string local_348;
  undefined1 local_328 [8];
  cmCPackIFWPackage package;
  string local_58;
  char *local_38;
  char *optIFW_PACKAGE_GROUP;
  allocator local_1a;
  undefined1 local_19;
  cmCPackIFWGenerator *local_18;
  cmCPackIFWGenerator *this_local;
  string *name;
  
  local_19 = 0;
  local_18 = this;
  this_local = (cmCPackIFWGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"root",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_58,"CPACK_IFW_PACKAGE_GROUP",
             (allocator *)(package.Directory.field_2._M_local_buf + 0xf));
  pcVar1 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator
            ((allocator<char> *)(package.Directory.field_2._M_local_buf + 0xf));
  local_38 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_378,"CPACK_IFW_PACKAGE_NAME",
               (allocator *)((long)&optPACKAGE_NAME + 7));
    pcVar1 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_378);
    std::__cxx11::string::~string((string *)&local_378);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optPACKAGE_NAME + 7));
    local_358 = pcVar1;
    if (pcVar1 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3a8,"CPACK_PACKAGE_NAME",&local_3a9);
      pcVar1 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,&local_3a8);
      std::__cxx11::string::~string((string *)&local_3a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
      if (pcVar1 != (char *)0x0) {
        local_388 = pcVar1;
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar1);
      }
    }
    else {
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar1);
    }
  }
  else {
    cmCPackIFWPackage::cmCPackIFWPackage((cmCPackIFWPackage *)local_328);
    pcVar1 = local_38;
    local_328 = (undefined1  [8])this;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_348,pcVar1,(allocator *)((long)&optIFW_PACKAGE_NAME + 7));
    cmCPackIFWPackage::ConfigureFromGroup((cmCPackIFWPackage *)local_328,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator((allocator<char> *)((long)&optIFW_PACKAGE_NAME + 7));
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,
               (string *)(package.ReleaseDate.field_2._M_local_buf + 8));
    cmCPackIFWPackage::~cmCPackIFWPackage((cmCPackIFWPackage *)local_328);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackIFWGenerator::GetRootPackageName()
{
  // Default value
  std::string name = "root";
  if (const char* optIFW_PACKAGE_GROUP =
        this->GetOption("CPACK_IFW_PACKAGE_GROUP")) {
    // Configure from root group
    cmCPackIFWPackage package;
    package.Generator = this;
    package.ConfigureFromGroup(optIFW_PACKAGE_GROUP);
    name = package.Name;
  } else if (const char* optIFW_PACKAGE_NAME =
               this->GetOption("CPACK_IFW_PACKAGE_NAME")) {
    // Configure from root package name
    name = optIFW_PACKAGE_NAME;
  } else if (const char* optPACKAGE_NAME =
               this->GetOption("CPACK_PACKAGE_NAME")) {
    // Configure from package name
    name = optPACKAGE_NAME;
  }
  return name;
}